

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O0

void test_char_dimensions(wins *wins_ar,int ar_len)

{
  Am_Drawonable *font_win_00;
  undefined4 uVar1;
  int local_58;
  int i_1;
  int char_width;
  Am_Drawonable *font_win;
  char local_3d;
  int i;
  char the_char;
  Am_Font local_30 [8];
  int local_28;
  int local_24;
  int size;
  int fam;
  int ital;
  int top;
  int n;
  int ar_len_local;
  wins *wins_ar_local;
  
  fam = 0;
  top = ar_len;
  _n = wins_ar;
  for (size = 0; size < 2; size = size + 1) {
    ital = 0;
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
        Am_Font::Am_Font(local_30,test_char_dimensions::family_array[local_24],false,size != 0,false
                         ,test_char_dimensions::size_array[local_28]);
        Am_Font::operator=((Am_Font *)&test_font,local_30);
        Am_Font::~Am_Font(local_30);
        local_3d = test_char_dimensions::char_list[ital];
        test_string = &local_3d;
        test_str_len = 1;
        ital = ital + 1;
        for (font_win._4_4_ = 0; font_win._4_4_ < top; font_win._4_4_ = font_win._4_4_ + 1) {
          font_win_00 = _n[font_win._4_4_].font_win;
          update_font_numbers(font_win_00,false);
          uVar1 = (**(code **)(*(long *)font_win_00 + 0xc0))(font_win_00,&test_font,(int)local_3d);
          (**(code **)(*(long *)font_win_00 + 0x170))
                    (font_win_00,&black,&local_3d,1,&test_font,0xaf,fam,0,&Am_No_Style,0);
          (**(code **)(*(long *)font_win_00 + 0x160))
                    (font_win_00,&black,&Am_No_Style,0xaf,fam,uVar1,test_string_height,0);
        }
        fam = fam + test_string_height + 4;
      }
    }
  }
  for (local_58 = 0; local_58 < top; local_58 = local_58 + 1) {
    (**(code **)(*(long *)_n[local_58].font_win + 0xa0))();
  }
  return;
}

Assistant:

void
test_char_dimensions(wins *wins_ar, int ar_len)
{
  // Since family_array and size_array are static, they persists across
  // multiple invocations of the enclosing function.  They will not be
  // reinitialized when the function is invoked a second time.
  static Am_Font_Family_Flag family_array[3] = {Am_FONT_FIXED, Am_FONT_SERIF,
                                                Am_FONT_SANS_SERIF};
  static Am_Font_Size_Flag size_array[3] = {Am_FONT_SMALL, Am_FONT_MEDIUM,
                                            Am_FONT_VERY_LARGE};
  int n;
  int top = 0;
  static const char *char_list = "AbgXij8.-@`|";
  for (int ital = 0; ital < 2; ital++) {
    n = 0;
    for (int fam = 0; fam < 3; fam++) {
      for (int size = 0; size < 3; size++) {
        test_font =
            Am_Font(family_array[fam], false, ital, false, size_array[size]);
        char the_char = char_list[n++];
        test_string = &the_char;
        test_str_len = 1;
        for (int i = 0; i < ar_len; i++) {
          Am_Drawonable *font_win = wins_ar[i].font_win;
          update_font_numbers(font_win); // To get test_string_height
          int char_width = font_win->Get_Char_Width(test_font, the_char);
          font_win->Draw_Text(black, &the_char, 1, test_font, 175, top);
          font_win->Draw_Rectangle(black, Am_No_Style, 175, top, char_width,
                                   test_string_height);
        }
        top = top + test_string_height + 4;
      }
    }
  }
  for (int i = 0; i < ar_len; i++) {
    (wins_ar[i].font_win)->Flush_Output();
  }
}